

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O0

Status __thiscall
leveldb::FaultInjectionTestEnv::NewAppendableFile
          (FaultInjectionTestEnv *this,string *fname,WritableFile **result)

{
  bool bVar1;
  Env *pEVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  TestWritableFile *this_00;
  WritableFile *in_RCX;
  MutexLock local_88;
  MutexLock l;
  FileState state;
  WritableFile *local_30;
  WritableFile *actual_writable_file;
  WritableFile **result_local;
  string *fname_local;
  FaultInjectionTestEnv *this_local;
  Status *s;
  
  actual_writable_file = in_RCX;
  result_local = result;
  fname_local = fname;
  this_local = this;
  pEVar2 = EnvWrapper::target((EnvWrapper *)fname);
  (*pEVar2->_vptr_Env[5])(this,pEVar2,result_local,&local_30);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    anon_unknown_7::FileState::FileState((FileState *)&l,(string *)result_local);
    MutexLock::MutexLock(&local_88,(Mutex *)(fname + 0x10));
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
                     *)(fname + 0x38),(key_type *)result_local);
    if (sVar3 == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(fname + 0x68),(value_type *)result_local);
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
                             *)(fname + 0x38),(key_type *)result_local);
      anon_unknown_7::FileState::operator=((FileState *)&l,pmVar4);
    }
    MutexLock::~MutexLock(&local_88);
    this_00 = (TestWritableFile *)operator_new(0x58);
    TestWritableFile::TestWritableFile
              (this_00,(FileState *)&l,local_30,(FaultInjectionTestEnv *)fname);
    actual_writable_file->_vptr_WritableFile = (_func_int **)this_00;
    anon_unknown_7::FileState::~FileState((FileState *)&l);
  }
  return (Status)(char *)this;
}

Assistant:

Status FaultInjectionTestEnv::NewAppendableFile(const std::string& fname,
                                                WritableFile** result) {
  WritableFile* actual_writable_file;
  Status s = target()->NewAppendableFile(fname, &actual_writable_file);
  if (s.ok()) {
    FileState state(fname);
    state.pos_ = 0;
    {
      MutexLock l(&mutex_);
      if (db_file_state_.count(fname) == 0) {
        new_files_since_last_dir_sync_.insert(fname);
      } else {
        state = db_file_state_[fname];
      }
    }
    *result = new TestWritableFile(state, actual_writable_file, this);
  }
  return s;
}